

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangw.c
# Opt level: O2

int parse_rtlist(char *prgname,uchar *rxbuf,int len)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  ulong uVar9;
  uint local_60;
  uint local_5c;
  uint local_58;
  char ifname [16];
  
  while( true ) {
    if (((len < 0x10) || (*(uint *)rxbuf < 0x10)) || (len < (int)*(uint *)rxbuf)) {
      return 0;
    }
    if ((short)*(uint *)((long)rxbuf + 4) == 3) {
      return 1;
    }
    if ((short)*(uint *)((long)rxbuf + 4) == 2) {
      puts("NLMSG_ERROR");
      return 1;
    }
    if ((char)*(uint *)((long)rxbuf + 0x10) != '\x1d') break;
    if (*(char *)((long)rxbuf + 0x11) != '\x01') {
      pcVar4 = "received msg with unknown gwtype %d\n";
      goto LAB_0010216a;
    }
    pcVar4 = __xpg_basename(prgname);
    uVar7 = 0;
    printf("%s -A ",pcVar4);
    puVar8 = (uint *)((long)rxbuf + 0x14);
    uVar3 = 0;
    local_58 = 0;
    local_5c = 0;
    local_60 = 0;
    puVar5 = puVar8;
    for (uVar2 = *(uint *)rxbuf - 0x14; 3 < (int)uVar2; uVar2 = uVar2 - uVar6) {
      uVar1 = (ushort)*puVar5;
      if ((uVar1 < 4) || (uVar2 < uVar1)) break;
      switch(*(ushort *)((long)puVar5 + 2)) {
      case 1:
      case 2:
      case 3:
      case 4:
      case 5:
      case 6:
      case 0xb:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
        break;
      case 7:
        local_58 = puVar5[1];
        break;
      case 8:
        local_5c = puVar5[1];
        break;
      case 9:
        uVar7 = puVar5[1];
        break;
      case 10:
        uVar3 = puVar5[1];
        break;
      case 0xc:
        local_60 = puVar5[1];
        break;
      default:
        goto switchD_00101f36_default;
      }
      uVar6 = uVar1 + 3 & 0xfffffffc;
      puVar5 = (uint *)((long)puVar5 + (ulong)uVar6);
    }
    pcVar4 = if_indextoname(uVar7,ifname);
    printf("-s %s ",pcVar4);
    pcVar4 = if_indextoname(uVar3,ifname);
    printf("-d %s ",pcVar4);
    uVar1 = *(ushort *)((long)rxbuf + 0x12);
    if ((uVar1 & 8) != 0) {
      printf("-X ");
      uVar1 = *(ushort *)((long)rxbuf + 0x12);
    }
    if ((uVar1 & 1) != 0) {
      printf("-e ");
      uVar1 = *(ushort *)((long)rxbuf + 0x12);
    }
    if ((uVar1 & 2) != 0) {
      printf("-t ");
      uVar1 = *(ushort *)((long)rxbuf + 0x12);
    }
    if ((uVar1 & 4) != 0) {
      printf("-i ");
    }
    uVar7 = *(uint *)rxbuf - 0x14;
    for (; ((3 < (int)uVar7 && (3 < (ushort)*puVar8)) && ((ushort)*puVar8 <= uVar7));
        puVar8 = (uint *)((long)puVar8 + (ulong)uVar3)) {
      switch(*(ushort *)((long)puVar8 + 2)) {
      case 1:
        pcVar4 = "AND";
        goto LAB_001020c7;
      case 2:
        pcVar4 = "OR";
        goto LAB_001020c7;
      case 3:
        pcVar4 = "XOR";
        goto LAB_001020c7;
      case 4:
        pcVar4 = "SET";
LAB_001020c7:
        printmod(pcVar4,puVar8 + 1);
        break;
      case 5:
        print_cs_xor((cgw_csum_xor *)(puVar8 + 1));
        break;
      case 6:
        print_cs_crc8((cgw_csum_crc8 *)(puVar8 + 1));
        break;
      case 7:
      case 8:
      case 9:
      case 10:
      case 0xc:
        break;
      case 0xb:
        printfilter(puVar8 + 1);
        break;
      case 0xd:
        uVar9 = (ulong)(byte)puVar8[1];
        pcVar4 = "-l %d ";
        goto LAB_0010209b;
      case 0xe:
        uVar9 = (ulong)puVar8[1];
        pcVar4 = "-u %X ";
LAB_0010209b:
        printf(pcVar4,uVar9);
        break;
      case 0xf:
        pcVar4 = "AND";
        goto LAB_001020f3;
      case 0x10:
        pcVar4 = "OR";
        goto LAB_001020f3;
      case 0x11:
        pcVar4 = "XOR";
        goto LAB_001020f3;
      case 0x12:
        pcVar4 = "SET";
LAB_001020f3:
        printfdmod(pcVar4,puVar8 + 1);
        break;
      default:
        goto switchD_00101f36_default;
      }
      uVar3 = (ushort)*puVar8 + 3 & 0xfffffffc;
      uVar7 = uVar7 - uVar3;
    }
    printf("# %d handled %d dropped %d deleted\n",(ulong)local_58,(ulong)local_5c,(ulong)local_60);
    uVar7 = *(uint *)rxbuf + 3 & 0xfffffffc;
    len = len - uVar7;
    rxbuf = (uchar *)((long)rxbuf + (ulong)uVar7);
  }
  pcVar4 = "received msg from unknown family %d\n";
LAB_0010216a:
  printf(pcVar4);
  return -0x16;
switchD_00101f36_default:
  pcVar4 = "Unknown attribute %d!";
  goto LAB_0010216a;
}

Assistant:

int parse_rtlist(char *prgname, unsigned char *rxbuf, int len)
{
	char ifname[IF_NAMESIZE]; /* interface name for if_indextoname() */
	struct rtcanmsg *rtc;
	struct rtattr *rta;
	struct nlmsghdr *nlh;
	unsigned int src_ifindex = 0;
	unsigned int dst_ifindex = 0;
	__u32 handled, dropped, deleted;
	int rtlen;


	nlh = (struct nlmsghdr *)rxbuf;

	while (1) {
		if (!NLMSG_OK(nlh, len))
			return 0;

		if (nlh->nlmsg_type == NLMSG_ERROR) {
			printf("NLMSG_ERROR\n");
			return 1;
		}

		if (nlh->nlmsg_type == NLMSG_DONE) {
			//printf("NLMSG_DONE\n");
			return 1;
		}

		rtc = (struct rtcanmsg *)NLMSG_DATA(nlh);
		if (rtc->can_family != AF_CAN) {
			printf("received msg from unknown family %d\n", rtc->can_family);
			return -EINVAL;
		}

		if (rtc->gwtype != CGW_TYPE_CAN_CAN) {
			printf("received msg with unknown gwtype %d\n", rtc->gwtype);
			return -EINVAL;
		}

		/*
		 * print list in a representation that
		 * can be used directly for start scripts.
		 *
		 * To order the mandatory and optional parameters in the
		 * output string, the NLMSG is parsed twice.
		 */

		handled = 0;
		dropped = 0;
		deleted = 0;
		src_ifindex = 0;
		dst_ifindex = 0;

		printf("%s -A ", basename(prgname));

		/* first parse for mandatory options */
		rta = (struct rtattr *) RTCAN_RTA(rtc);
		rtlen = RTCAN_PAYLOAD(nlh);
		for(;RTA_OK(rta, rtlen);rta=RTA_NEXT(rta,rtlen))
		{
			//printf("(A-%d)", rta->rta_type);
			switch(rta->rta_type) {

			case CGW_FILTER:
			case CGW_MOD_AND:
			case CGW_MOD_OR:
			case CGW_MOD_XOR:
			case CGW_MOD_SET:
			case CGW_FDMOD_AND:
			case CGW_FDMOD_OR:
			case CGW_FDMOD_XOR:
			case CGW_FDMOD_SET:
			case CGW_MOD_UID:
			case CGW_LIM_HOPS:
			case CGW_CS_XOR:
			case CGW_CS_CRC8:
				break;

			case CGW_SRC_IF:
				src_ifindex = *(__u32 *)RTA_DATA(rta);
				break;

			case CGW_DST_IF:
				dst_ifindex = *(__u32 *)RTA_DATA(rta);
				break;

			case CGW_HANDLED:
				handled = *(__u32 *)RTA_DATA(rta);
				break;

			case CGW_DROPPED:
				dropped = *(__u32 *)RTA_DATA(rta);
				break;

			case CGW_DELETED:
				deleted = *(__u32 *)RTA_DATA(rta);
				break;

			default:
				printf("Unknown attribute %d!", rta->rta_type);
				return -EINVAL;
				break;
			}
		}


		printf("-s %s ", if_indextoname(src_ifindex, ifname));
		printf("-d %s ", if_indextoname(dst_ifindex, ifname));

		if (rtc->flags & CGW_FLAGS_CAN_FD)
			printf("-X ");

		if (rtc->flags & CGW_FLAGS_CAN_ECHO)
			printf("-e ");

		if (rtc->flags & CGW_FLAGS_CAN_SRC_TSTAMP)
			printf("-t ");

		if (rtc->flags & CGW_FLAGS_CAN_IIF_TX_OK)
			printf("-i ");

		/* second parse for mod attributes */
		rta = (struct rtattr *) RTCAN_RTA(rtc);
		rtlen = RTCAN_PAYLOAD(nlh);
		for(;RTA_OK(rta, rtlen);rta=RTA_NEXT(rta,rtlen))
		{
			//printf("(B-%d)", rta->rta_type);
			switch(rta->rta_type) {

			case CGW_FILTER:
				printfilter(RTA_DATA(rta));
				break;

			case CGW_MOD_AND:
				printmod("AND", RTA_DATA(rta));
				break;

			case CGW_MOD_OR:
				printmod("OR", RTA_DATA(rta));
				break;

			case CGW_MOD_XOR:
				printmod("XOR", RTA_DATA(rta));
				break;

			case CGW_MOD_SET:
				printmod("SET", RTA_DATA(rta));
				break;

			case CGW_FDMOD_AND:
				printfdmod("AND", RTA_DATA(rta));
				break;

			case CGW_FDMOD_OR:
				printfdmod("OR", RTA_DATA(rta));
				break;

			case CGW_FDMOD_XOR:
				printfdmod("XOR", RTA_DATA(rta));
				break;

			case CGW_FDMOD_SET:
				printfdmod("SET", RTA_DATA(rta));
				break;

			case CGW_MOD_UID:
				printf("-u %X ", *(__u32 *)RTA_DATA(rta));
				break;

			case CGW_LIM_HOPS:
				printf("-l %d ", *(__u8 *)RTA_DATA(rta));
				break;

			case CGW_CS_XOR:
				print_cs_xor((struct cgw_csum_xor *)RTA_DATA(rta));
				break;

			case CGW_CS_CRC8:
				print_cs_crc8((struct cgw_csum_crc8 *)RTA_DATA(rta));
				break;

			case CGW_SRC_IF:
			case CGW_DST_IF:
			case CGW_HANDLED:
			case CGW_DROPPED:
			case CGW_DELETED:
				break;

			default:
				printf("Unknown attribute %d!", rta->rta_type);
				return -EINVAL;
				break;
			}
		}

		/* end of entry */
		printf("# %d handled %d dropped %d deleted\n",
		       handled, dropped, deleted);

		/* jump to next NLMSG in the given buffer */
		nlh = NLMSG_NEXT(nlh, len);
	}
}